

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

Address * __thiscall cppnet::Address::ToIpv4(Address *this,string *ip)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  string *in_RDX;
  allocator local_29;
  long local_28;
  size_t pos;
  string *ip_local;
  Address *this_local;
  
  pos = (size_t)in_RDX;
  ip_local = ip;
  this_local = this;
  bVar1 = IsIpv4(in_RDX);
  if (bVar1) {
    std::__cxx11::string::string((string *)this,(string *)pos);
  }
  else {
    local_28 = std::__cxx11::string::rfind((char)pos,0x3a);
    pcVar2 = (char *)std::__cxx11::string::operator[](pos);
    lVar3 = std::__cxx11::string::length();
    uVar4 = lVar3 - local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar2,uVar4,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return this;
}

Assistant:

std::string Address::ToIpv4(const std::string& ip) {
    if (IsIpv4(ip)) {
        return ip;
    }
    std::size_t pos = ip.rfind(':');

    return std::string(&ip[pos], ip.length() - pos);
}